

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_trace_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  ushort *puVar2;
  short *psVar3;
  undefined1 auVar4 [16];
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  parasail_result_t *ppVar41;
  __m128i *palVar42;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *palVar43;
  __m128i *ptr_01;
  __m128i *ptr_02;
  int16_t *ptr_03;
  ulong uVar44;
  undefined2 uVar45;
  int16_t iVar46;
  uint uVar47;
  long lVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  int a;
  ulong uVar58;
  bool bVar59;
  short sVar60;
  short sVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  short sVar76;
  short sVar78;
  short sVar79;
  short sVar81;
  short sVar83;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar74;
  short sVar85;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  short sVar75;
  short sVar77;
  short sVar80;
  short sVar82;
  short sVar84;
  undefined1 auVar73 [16];
  ushort uVar86;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar96;
  ushort uVar98;
  ushort uVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ulong uVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  short sVar118;
  ushort uVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  ushort uVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  ushort uVar128;
  short sVar129;
  ushort uVar130;
  short sVar131;
  undefined1 in_XMM9 [16];
  undefined1 auVar132 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar133 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar134 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar135 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar136 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  long local_110;
  ushort local_104;
  __m128i *local_100;
  __m128i *local_d0;
  ushort local_88;
  ushort uStack_86;
  __m128i local_58;
  longlong local_48;
  longlong lStack_40;
  ushort uVar95;
  ushort uVar97;
  ushort uVar99;
  ushort uVar101;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_trace_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_nw_trace_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_nw_trace_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar47 = profile->s1Len;
        if ((int)uVar47 < 1) {
          parasail_nw_trace_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_trace_striped_profile_sse41_128_16_cold_4();
        }
        else {
          uVar56 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_trace_striped_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_trace_striped_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_trace_striped_profile_sse41_128_16_cold_1();
          }
          else {
            iVar37 = uVar47 - 1;
            uVar58 = (ulong)uVar47 + 7 >> 3;
            a = (int)uVar58;
            iVar49 = -open;
            iVar40 = ppVar6->min;
            iVar50 = -iVar40;
            if (iVar40 != iVar49 && SBORROW4(iVar40,iVar49) == iVar40 + open < 0) {
              iVar50 = open;
            }
            iVar36 = ppVar6->max;
            ppVar41 = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (ppVar41 != (parasail_result_t *)0x0) {
              ppVar41->flag = ppVar41->flag | 0x8280801;
              palVar42 = parasail_memalign___m128i(0x10,uVar58);
              ptr = parasail_memalign___m128i(0x10,uVar58);
              ptr_00 = parasail_memalign___m128i(0x10,uVar58);
              palVar43 = parasail_memalign___m128i(0x10,uVar58);
              ptr_01 = parasail_memalign___m128i(0x10,uVar58);
              ptr_02 = parasail_memalign___m128i(0x10,uVar58);
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_03 != (int16_t *)0x0 &&
                  (ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0)) &&
                  ((palVar43 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar42 != (__m128i *)0x0))) {
                iVar38 = s2Len + -1;
                iVar39 = 7 - iVar37 / a;
                auVar65 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar62 = auVar65._0_4_;
                auVar65 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar63 = auVar65._0_4_;
                uVar47 = iVar50 - 0x7fff;
                auVar65 = pshuflw(ZEXT416(uVar47),ZEXT416(uVar47),0);
                local_88 = auVar65._0_2_;
                uStack_86 = auVar65._2_2_;
                auVar66 = ZEXT416(CONCAT22((short)((uint)iVar40 >> 0x10),0x7ffe - (short)iVar36));
                auVar66 = pshuflw(auVar66,auVar66,0);
                uVar64 = auVar66._0_4_;
                sVar121 = auVar66._0_2_;
                sVar124 = auVar66._2_2_;
                lVar51 = (long)iVar49;
                uVar52 = 0;
                do {
                  lVar57 = 0;
                  lVar55 = lVar51;
                  do {
                    uVar45 = 0x8000;
                    if (-0x8000 < lVar55) {
                      uVar45 = (undefined2)lVar55;
                    }
                    *(undefined2 *)((long)&local_48 + lVar57 * 2) = uVar45;
                    lVar48 = lVar55 - (ulong)(uint)open;
                    if (lVar48 < -0x7fff) {
                      lVar48 = -0x8000;
                    }
                    *(short *)((long)local_58 + lVar57 * 2) = (short)lVar48;
                    lVar57 = lVar57 + 1;
                    lVar55 = lVar55 - uVar58 * (uint)gap;
                  } while (lVar57 != 8);
                  palVar42[uVar52][0] = local_48;
                  palVar42[uVar52][1] = lStack_40;
                  ptr_00[uVar52] = local_58;
                  palVar43[uVar52] = local_58;
                  uVar52 = uVar52 + 1;
                  lVar51 = lVar51 - (ulong)(uint)gap;
                } while (uVar52 != uVar58);
                *ptr_03 = 0;
                uVar52 = 1;
                do {
                  iVar46 = -0x8000;
                  if (-0x8000 < iVar49) {
                    iVar46 = (int16_t)iVar49;
                  }
                  ptr_03[uVar52] = iVar46;
                  uVar52 = uVar52 + 1;
                  iVar49 = iVar49 - gap;
                } while (s2Len + 1 != uVar52);
                lVar55 = (ulong)(a + (uint)(a == 0)) << 4;
                lVar51 = 0;
                auVar66 = pmovsxbw((undefined1  [16])local_58,0x808080808080808);
                do {
                  *(undefined1 (*) [16])((long)((ppVar41->field_4).rowcols)->score_row + lVar51) =
                       auVar66;
                  lVar51 = lVar51 + 0x10;
                } while (lVar55 != lVar51);
                uVar52 = 1;
                if (1 < s2Len) {
                  uVar52 = uVar56;
                }
                lVar57 = uVar58 * 0x10;
                lVar51 = 0;
                auVar66 = pmovsxbw(in_XMM9,0x202020202020202);
                auVar133 = pmovsxbw(in_XMM12,0x4040404040404040);
                auVar134 = pmovsxbw(in_XMM13,0x2020202020202020);
                auVar135 = pmovsxbw(in_XMM14,0x7878787878787878);
                auVar136 = pmovsxbw(in_XMM15,0x1f1f1f1f1f1f1f1f);
                uVar53 = 0;
                uVar32 = uVar64;
                uVar33 = uVar64;
                uVar34 = uVar64;
                uVar110 = local_88;
                uVar111 = uStack_86;
                uVar112 = local_88;
                uVar113 = uStack_86;
                uVar114 = local_88;
                uVar115 = uStack_86;
                uVar116 = local_88;
                uVar117 = uStack_86;
                local_110 = lVar57;
                do {
                  local_d0 = ptr_01;
                  local_100 = ptr;
                  ptr = palVar42;
                  ptr_01 = palVar43;
                  uVar1 = ptr[a - 1U][0];
                  auVar67._8_8_ = ptr[a - 1U][1] << 0x10 | uVar1 >> 0x30;
                  auVar67._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_03[uVar53];
                  lVar48 = uVar58 * (long)ppVar6->mapper[(byte)s2[uVar53]];
                  uVar1 = uVar53 + 1;
                  uVar44 = 1;
                  lVar54 = 0;
                  auVar109._4_2_ = local_88;
                  auVar109._0_4_ = auVar65._0_4_;
                  auVar109._6_2_ = uStack_86;
                  auVar109._8_2_ = local_88;
                  auVar109._10_2_ = uStack_86;
                  auVar109._12_2_ = local_88;
                  auVar109._14_2_ = uStack_86;
                  do {
                    sVar131 = (short)((uint)uVar34 >> 0x10);
                    sVar129 = (short)uVar34;
                    sVar127 = (short)((uint)uVar33 >> 0x10);
                    sVar126 = (short)uVar33;
                    sVar125 = (short)((uint)uVar32 >> 0x10);
                    sVar122 = (short)uVar32;
                    sVar120 = (short)((uint)uVar64 >> 0x10);
                    sVar118 = (short)uVar64;
                    auVar4 = *(undefined1 (*) [16])((long)*ptr_00 + lVar54);
                    auVar67 = paddsw(auVar67,*(undefined1 (*) [16])
                                              ((long)pvVar5 + lVar54 + lVar48 * 0x10));
                    sVar8 = auVar4._0_2_;
                    uVar119 = auVar67._0_2_;
                    uVar86 = (ushort)((short)uVar119 < sVar8) * sVar8 |
                             ((short)uVar119 >= sVar8) * uVar119;
                    sVar11 = auVar4._2_2_;
                    uVar123 = auVar67._2_2_;
                    uVar91 = (ushort)((short)uVar123 < sVar11) * sVar11 |
                             ((short)uVar123 >= sVar11) * uVar123;
                    sVar61 = auVar4._4_2_;
                    uVar128 = auVar67._4_2_;
                    uVar92 = (ushort)((short)uVar128 < sVar61) * sVar61 |
                             ((short)uVar128 >= sVar61) * uVar128;
                    sVar80 = auVar4._6_2_;
                    uVar130 = auVar67._6_2_;
                    uVar93 = (ushort)((short)uVar130 < sVar80) * sVar80 |
                             ((short)uVar130 >= sVar80) * uVar130;
                    sVar14 = auVar4._8_2_;
                    uVar95 = auVar67._8_2_;
                    uVar94 = (ushort)((short)uVar95 < sVar14) * sVar14 |
                             ((short)uVar95 >= sVar14) * uVar95;
                    sVar17 = auVar4._10_2_;
                    uVar97 = auVar67._10_2_;
                    uVar96 = (ushort)((short)uVar97 < sVar17) * sVar17 |
                             ((short)uVar97 >= sVar17) * uVar97;
                    sVar20 = auVar4._12_2_;
                    uVar99 = auVar67._12_2_;
                    uVar101 = auVar67._14_2_;
                    uVar98 = (ushort)((short)uVar99 < sVar20) * sVar20 |
                             ((short)uVar99 >= sVar20) * uVar99;
                    sVar23 = auVar4._14_2_;
                    uVar100 = (ushort)((short)uVar101 < sVar23) * sVar23 |
                              ((short)uVar101 >= sVar23) * uVar101;
                    sVar9 = auVar109._0_2_;
                    auVar106._0_2_ =
                         (ushort)((short)uVar86 < sVar9) * sVar9 | ((short)uVar86 >= sVar9) * uVar86
                    ;
                    sVar12 = auVar109._2_2_;
                    auVar106._2_2_ =
                         (ushort)((short)uVar91 < sVar12) * sVar12 |
                         ((short)uVar91 >= sVar12) * uVar91;
                    sVar75 = auVar109._4_2_;
                    auVar106._4_2_ =
                         (ushort)((short)uVar92 < sVar75) * sVar75 |
                         ((short)uVar92 >= sVar75) * uVar92;
                    sVar82 = auVar109._6_2_;
                    auVar106._6_2_ =
                         (ushort)((short)uVar93 < sVar82) * sVar82 |
                         ((short)uVar93 >= sVar82) * uVar93;
                    sVar15 = auVar109._8_2_;
                    auVar106._8_2_ =
                         (ushort)((short)uVar94 < sVar15) * sVar15 |
                         ((short)uVar94 >= sVar15) * uVar94;
                    sVar18 = auVar109._10_2_;
                    auVar106._10_2_ =
                         (ushort)((short)uVar96 < sVar18) * sVar18 |
                         ((short)uVar96 >= sVar18) * uVar96;
                    sVar21 = auVar109._12_2_;
                    auVar106._12_2_ =
                         (ushort)((short)uVar98 < sVar21) * sVar21 |
                         ((short)uVar98 >= sVar21) * uVar98;
                    sVar24 = auVar109._14_2_;
                    auVar106._14_2_ =
                         (ushort)((short)uVar100 < sVar24) * sVar24 |
                         ((short)uVar100 >= sVar24) * uVar100;
                    *(undefined1 (*) [16])((long)*local_100 + lVar54) = auVar106;
                    auVar68._0_2_ = -(ushort)(uVar119 == auVar106._0_2_);
                    auVar68._2_2_ = -(ushort)(uVar123 == auVar106._2_2_);
                    auVar68._4_2_ = -(ushort)(uVar128 == auVar106._4_2_);
                    auVar68._6_2_ = -(ushort)(uVar130 == auVar106._6_2_);
                    auVar68._8_2_ = -(ushort)(uVar95 == auVar106._8_2_);
                    auVar68._10_2_ = -(ushort)(uVar97 == auVar106._10_2_);
                    auVar68._12_2_ = -(ushort)(uVar99 == auVar106._12_2_);
                    auVar68._14_2_ = -(ushort)(uVar101 == auVar106._14_2_);
                    auVar87._0_2_ = auVar66._0_2_ - (ushort)(sVar9 < (short)uVar86);
                    auVar87._2_2_ = auVar66._2_2_ - (ushort)(sVar12 < (short)uVar91);
                    auVar87._4_2_ = auVar66._4_2_ - (ushort)(sVar75 < (short)uVar92);
                    auVar87._6_2_ = auVar66._6_2_ - (ushort)(sVar82 < (short)uVar93);
                    auVar87._8_2_ = auVar66._8_2_ - (ushort)(sVar15 < (short)uVar94);
                    auVar87._10_2_ = auVar66._10_2_ - (ushort)(sVar18 < (short)uVar96);
                    auVar87._12_2_ = auVar66._12_2_ - (ushort)(sVar21 < (short)uVar98);
                    auVar87._14_2_ = auVar66._14_2_ - (ushort)(sVar24 < (short)uVar100);
                    auVar88 = pblendvb(auVar87,_DAT_008d25c0,auVar68);
                    auVar67 = *(undefined1 (*) [16])
                               ((long)((ppVar41->field_4).rowcols)->score_row + lVar54 + lVar51);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar54) = auVar88;
                    *(undefined1 (*) [16])
                     ((long)((ppVar41->field_4).rowcols)->score_row + lVar54 + lVar51) =
                         auVar67 | auVar88;
                    auVar88._4_4_ = uVar62;
                    auVar88._0_4_ = uVar62;
                    auVar88._8_4_ = uVar62;
                    auVar88._12_4_ = uVar62;
                    auVar104 = psubsw(auVar106,auVar88);
                    auVar27._4_4_ = uVar63;
                    auVar27._0_4_ = uVar63;
                    auVar27._8_4_ = uVar63;
                    auVar27._12_4_ = uVar63;
                    auVar67 = psubsw(auVar4,auVar27);
                    sVar10 = auVar104._0_2_;
                    sVar60 = auVar67._0_2_;
                    sVar13 = auVar104._2_2_;
                    sVar74 = auVar67._2_2_;
                    sVar77 = auVar104._4_2_;
                    sVar76 = auVar67._4_2_;
                    sVar84 = auVar104._6_2_;
                    sVar78 = auVar67._6_2_;
                    sVar16 = auVar104._8_2_;
                    sVar79 = auVar67._8_2_;
                    sVar19 = auVar104._10_2_;
                    sVar81 = auVar67._10_2_;
                    sVar22 = auVar104._12_2_;
                    sVar83 = auVar67._12_2_;
                    sVar85 = auVar67._14_2_;
                    sVar25 = auVar104._14_2_;
                    puVar2 = (ushort *)((long)*ptr_00 + lVar54);
                    *puVar2 = (ushort)(sVar60 < sVar10) * sVar10 |
                              (ushort)(sVar60 >= sVar10) * sVar60;
                    puVar2[1] = (ushort)(sVar74 < sVar13) * sVar13 |
                                (ushort)(sVar74 >= sVar13) * sVar74;
                    puVar2[2] = (ushort)(sVar76 < sVar77) * sVar77 |
                                (ushort)(sVar76 >= sVar77) * sVar76;
                    puVar2[3] = (ushort)(sVar78 < sVar84) * sVar84 |
                                (ushort)(sVar78 >= sVar84) * sVar78;
                    puVar2[4] = (ushort)(sVar79 < sVar16) * sVar16 |
                                (ushort)(sVar79 >= sVar16) * sVar79;
                    puVar2[5] = (ushort)(sVar81 < sVar19) * sVar19 |
                                (ushort)(sVar81 >= sVar19) * sVar81;
                    puVar2[6] = (ushort)(sVar83 < sVar22) * sVar22 |
                                (ushort)(sVar83 >= sVar22) * sVar83;
                    puVar2[7] = (ushort)(sVar85 < sVar25) * sVar25 |
                                (ushort)(sVar85 >= sVar25) * sVar85;
                    auVar4._4_4_ = uVar63;
                    auVar4._0_4_ = uVar63;
                    auVar4._8_4_ = uVar63;
                    auVar4._12_4_ = uVar63;
                    auVar67 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar54),auVar4);
                    sVar60 = auVar67._0_2_;
                    sVar74 = auVar67._2_2_;
                    sVar76 = auVar67._4_2_;
                    sVar78 = auVar67._6_2_;
                    sVar79 = auVar67._8_2_;
                    sVar81 = auVar67._10_2_;
                    sVar83 = auVar67._12_2_;
                    sVar85 = auVar67._14_2_;
                    puVar2 = (ushort *)((long)*local_d0 + lVar54);
                    *puVar2 = (ushort)(sVar10 < sVar60) * sVar60 |
                              (ushort)(sVar10 >= sVar60) * sVar10;
                    puVar2[1] = (ushort)(sVar13 < sVar74) * sVar74 |
                                (ushort)(sVar13 >= sVar74) * sVar13;
                    puVar2[2] = (ushort)(sVar77 < sVar76) * sVar76 |
                                (ushort)(sVar77 >= sVar76) * sVar77;
                    puVar2[3] = (ushort)(sVar84 < sVar78) * sVar78 |
                                (ushort)(sVar84 >= sVar78) * sVar84;
                    puVar2[4] = (ushort)(sVar16 < sVar79) * sVar79 |
                                (ushort)(sVar16 >= sVar79) * sVar16;
                    puVar2[5] = (ushort)(sVar19 < sVar81) * sVar81 |
                                (ushort)(sVar19 >= sVar81) * sVar19;
                    puVar2[6] = (ushort)(sVar22 < sVar83) * sVar83 |
                                (ushort)(sVar22 >= sVar83) * sVar22;
                    puVar2[7] = (ushort)(sVar25 < sVar85) * sVar85 |
                                (ushort)(sVar25 >= sVar85) * sVar25;
                    if (uVar1 < uVar56) {
                      auVar69._0_2_ = -(ushort)(sVar60 < sVar10);
                      auVar69._2_2_ = -(ushort)(sVar74 < sVar13);
                      auVar69._4_2_ = -(ushort)(sVar76 < sVar77);
                      auVar69._6_2_ = -(ushort)(sVar78 < sVar84);
                      auVar69._8_2_ = -(ushort)(sVar79 < sVar16);
                      auVar69._10_2_ = -(ushort)(sVar81 < sVar19);
                      auVar69._12_2_ = -(ushort)(sVar83 < sVar22);
                      auVar69._14_2_ = -(ushort)(sVar85 < sVar25);
                      auVar67 = pmovsxbw(auVar67,0x1010101010101010);
                      auVar67 = pblendvb(auVar67,_DAT_008d0b90,auVar69);
                      *(undefined1 (*) [16])
                       ((long)((ppVar41->field_4).rowcols)->score_row + lVar54 + local_110) =
                           auVar67;
                    }
                    auVar28._4_4_ = uVar63;
                    auVar28._0_4_ = uVar63;
                    auVar28._8_4_ = uVar63;
                    auVar28._12_4_ = uVar63;
                    auVar103 = psubsw(auVar109,auVar28);
                    sVar60 = auVar103._0_2_;
                    sVar74 = auVar103._2_2_;
                    sVar76 = auVar103._4_2_;
                    sVar78 = auVar103._6_2_;
                    sVar79 = auVar103._8_2_;
                    sVar81 = auVar103._10_2_;
                    sVar83 = auVar103._12_2_;
                    sVar85 = auVar103._14_2_;
                    if (uVar44 < uVar58) {
                      piVar7 = ((ppVar41->field_4).rowcols)->score_row;
                      auVar70._0_2_ = -(ushort)(sVar60 < sVar10);
                      auVar70._2_2_ = -(ushort)(sVar74 < sVar13);
                      auVar70._4_2_ = -(ushort)(sVar76 < sVar77);
                      auVar70._6_2_ = -(ushort)(sVar78 < sVar84);
                      auVar70._8_2_ = -(ushort)(sVar79 < sVar16);
                      auVar70._10_2_ = -(ushort)(sVar81 < sVar19);
                      auVar70._12_2_ = -(ushort)(sVar83 < sVar22);
                      auVar70._14_2_ = -(ushort)(sVar85 < sVar25);
                      auVar67 = pblendvb(auVar133,auVar134,auVar70);
                      *(undefined1 (*) [16])((long)piVar7 + lVar54 + 0x10 + lVar51) =
                           auVar67 | *(undefined1 (*) [16])((long)piVar7 + lVar54 + 0x10 + lVar51);
                    }
                    uVar110 = ((short)uVar110 < (short)auVar106._0_2_) * auVar106._0_2_ |
                              ((short)uVar110 >= (short)auVar106._0_2_) * uVar110;
                    uVar111 = ((short)uVar111 < (short)auVar106._2_2_) * auVar106._2_2_ |
                              ((short)uVar111 >= (short)auVar106._2_2_) * uVar111;
                    uVar112 = ((short)uVar112 < (short)auVar106._4_2_) * auVar106._4_2_ |
                              ((short)uVar112 >= (short)auVar106._4_2_) * uVar112;
                    uVar113 = ((short)uVar113 < (short)auVar106._6_2_) * auVar106._6_2_ |
                              ((short)uVar113 >= (short)auVar106._6_2_) * uVar113;
                    uVar114 = ((short)uVar114 < (short)auVar106._8_2_) * auVar106._8_2_ |
                              ((short)uVar114 >= (short)auVar106._8_2_) * uVar114;
                    uVar115 = ((short)uVar115 < (short)auVar106._10_2_) * auVar106._10_2_ |
                              ((short)uVar115 >= (short)auVar106._10_2_) * uVar115;
                    uVar116 = ((short)uVar116 < (short)auVar106._12_2_) * auVar106._12_2_ |
                              ((short)uVar116 >= (short)auVar106._12_2_) * uVar116;
                    uVar117 = ((short)uVar117 < (short)auVar106._14_2_) * auVar106._14_2_ |
                              ((short)uVar117 >= (short)auVar106._14_2_) * uVar117;
                    uVar119 = (ushort)(sVar8 < sVar118) * sVar8 |
                              (ushort)(sVar8 >= sVar118) * sVar118;
                    uVar86 = (ushort)(sVar11 < sVar120) * sVar11 |
                             (ushort)(sVar11 >= sVar120) * sVar120;
                    uVar123 = (ushort)(sVar61 < sVar122) * sVar61 |
                              (ushort)(sVar61 >= sVar122) * sVar122;
                    uVar91 = (ushort)(sVar80 < sVar125) * sVar80 |
                             (ushort)(sVar80 >= sVar125) * sVar125;
                    uVar92 = (ushort)(sVar14 < sVar126) * sVar14 |
                             (ushort)(sVar14 >= sVar126) * sVar126;
                    uVar128 = (ushort)(sVar17 < sVar127) * sVar17 |
                              (ushort)(sVar17 >= sVar127) * sVar127;
                    uVar130 = (ushort)(sVar20 < sVar129) * sVar20 |
                              (ushort)(sVar20 >= sVar129) * sVar129;
                    uVar93 = (ushort)(sVar23 < sVar131) * sVar23 |
                             (ushort)(sVar23 >= sVar131) * sVar131;
                    uVar119 = (ushort)(sVar9 < (short)uVar119) * sVar9 |
                              (sVar9 >= (short)uVar119) * uVar119;
                    uVar86 = (ushort)(sVar12 < (short)uVar86) * sVar12 |
                             (sVar12 >= (short)uVar86) * uVar86;
                    uVar123 = (ushort)(sVar75 < (short)uVar123) * sVar75 |
                              (sVar75 >= (short)uVar123) * uVar123;
                    uVar91 = (ushort)(sVar82 < (short)uVar91) * sVar82 |
                             (sVar82 >= (short)uVar91) * uVar91;
                    uVar92 = (ushort)(sVar15 < (short)uVar92) * sVar15 |
                             (sVar15 >= (short)uVar92) * uVar92;
                    uVar128 = (ushort)(sVar18 < (short)uVar128) * sVar18 |
                              (sVar18 >= (short)uVar128) * uVar128;
                    uVar130 = (ushort)(sVar21 < (short)uVar130) * sVar21 |
                              (sVar21 >= (short)uVar130) * uVar130;
                    uVar93 = (ushort)(sVar24 < (short)uVar93) * sVar24 |
                             (sVar24 >= (short)uVar93) * uVar93;
                    uVar119 = ((short)auVar106._0_2_ < (short)uVar119) * auVar106._0_2_ |
                              ((short)auVar106._0_2_ >= (short)uVar119) * uVar119;
                    uVar86 = ((short)auVar106._2_2_ < (short)uVar86) * auVar106._2_2_ |
                             ((short)auVar106._2_2_ >= (short)uVar86) * uVar86;
                    uVar64 = CONCAT22(uVar86,uVar119);
                    uVar123 = ((short)auVar106._4_2_ < (short)uVar123) * auVar106._4_2_ |
                              ((short)auVar106._4_2_ >= (short)uVar123) * uVar123;
                    uVar91 = ((short)auVar106._6_2_ < (short)uVar91) * auVar106._6_2_ |
                             ((short)auVar106._6_2_ >= (short)uVar91) * uVar91;
                    uVar32 = CONCAT22(uVar91,uVar123);
                    uVar92 = ((short)auVar106._8_2_ < (short)uVar92) * auVar106._8_2_ |
                             ((short)auVar106._8_2_ >= (short)uVar92) * uVar92;
                    uVar128 = ((short)auVar106._10_2_ < (short)uVar128) * auVar106._10_2_ |
                              ((short)auVar106._10_2_ >= (short)uVar128) * uVar128;
                    uVar33 = CONCAT22(uVar128,uVar92);
                    uVar130 = ((short)auVar106._12_2_ < (short)uVar130) * auVar106._12_2_ |
                              ((short)auVar106._12_2_ >= (short)uVar130) * uVar130;
                    uVar93 = ((short)auVar106._14_2_ < (short)uVar93) * auVar106._14_2_ |
                             ((short)auVar106._14_2_ >= (short)uVar93) * uVar93;
                    uVar34 = CONCAT22(uVar93,uVar130);
                    auVar109._0_2_ =
                         (ushort)(sVar10 < sVar60) * sVar60 | (ushort)(sVar10 >= sVar60) * sVar10;
                    auVar109._2_2_ =
                         (ushort)(sVar13 < sVar74) * sVar74 | (ushort)(sVar13 >= sVar74) * sVar13;
                    auVar109._4_2_ =
                         (ushort)(sVar77 < sVar76) * sVar76 | (ushort)(sVar77 >= sVar76) * sVar77;
                    auVar109._6_2_ =
                         (ushort)(sVar84 < sVar78) * sVar78 | (ushort)(sVar84 >= sVar78) * sVar84;
                    auVar109._8_2_ =
                         (ushort)(sVar16 < sVar79) * sVar79 | (ushort)(sVar16 >= sVar79) * sVar16;
                    auVar109._10_2_ =
                         (ushort)(sVar19 < sVar81) * sVar81 | (ushort)(sVar19 >= sVar81) * sVar19;
                    auVar109._12_2_ =
                         (ushort)(sVar22 < sVar83) * sVar83 | (ushort)(sVar22 >= sVar83) * sVar22;
                    auVar109._14_2_ =
                         (ushort)(sVar25 < sVar85) * sVar85 | (ushort)(sVar25 >= sVar85) * sVar25;
                    auVar67 = *(undefined1 (*) [16])((long)*ptr + lVar54);
                    lVar54 = lVar54 + 0x10;
                    uVar44 = uVar44 + 1;
                  } while (lVar55 != lVar54);
                  auVar132 = auVar109;
                  uVar35 = 0;
                  do {
                    uVar44 = (ulong)(uint)(ptr_03[uVar1] - open);
                    if (ptr_03[uVar1] - open < -0x7fff) {
                      uVar44 = 0xffff8000;
                    }
                    uVar102 = ptr[a - 1U][0];
                    auVar107._8_8_ = ptr[a - 1U][1] << 0x10 | uVar102 >> 0x30;
                    auVar107._0_8_ = uVar102 << 0x10 | (ulong)(ushort)ptr_03[uVar53];
                    uVar102 = auVar104._0_8_;
                    auVar104._8_8_ = auVar104._8_8_ << 0x10 | uVar102 >> 0x30;
                    auVar104._0_8_ = uVar102 << 0x10 | uVar44 & 0xffff;
                    auVar71._8_8_ = auVar109._8_8_ << 0x10 | auVar109._0_8_ >> 0x30;
                    auVar71._0_8_ = auVar109._0_8_ << 0x10 | uVar44 & 0xffff;
                    uVar102 = auVar103._0_8_;
                    auVar103._8_8_ = auVar103._8_8_ << 0x10 | uVar102 >> 0x30;
                    local_104 = (ushort)uVar47;
                    auVar103._0_8_ = uVar102 << 0x10 | (ulong)local_104;
                    uVar102 = auVar132._0_8_;
                    auVar132._8_8_ = auVar132._8_8_ << 0x10 | uVar102 >> 0x30;
                    auVar132._0_8_ = uVar102 << 0x10 | uVar44 & 0xffff;
                    bVar59 = true;
                    uVar44 = 1;
                    lVar54 = 0;
                    do {
                      psVar3 = (short *)((long)*local_100 + lVar54);
                      sVar61 = *psVar3;
                      sVar75 = psVar3[1];
                      sVar77 = psVar3[2];
                      sVar76 = psVar3[3];
                      sVar80 = psVar3[4];
                      sVar82 = psVar3[5];
                      sVar84 = psVar3[6];
                      sVar78 = psVar3[7];
                      sVar8 = auVar71._0_2_;
                      auVar89._0_2_ =
                           (ushort)(sVar61 < sVar8) * sVar8 | (ushort)(sVar61 >= sVar8) * sVar61;
                      sVar9 = auVar71._2_2_;
                      auVar89._2_2_ =
                           (ushort)(sVar75 < sVar9) * sVar9 | (ushort)(sVar75 >= sVar9) * sVar75;
                      sVar10 = auVar71._4_2_;
                      auVar89._4_2_ =
                           (ushort)(sVar77 < sVar10) * sVar10 | (ushort)(sVar77 >= sVar10) * sVar77;
                      sVar60 = auVar71._6_2_;
                      auVar89._6_2_ =
                           (ushort)(sVar76 < sVar60) * sVar60 | (ushort)(sVar76 >= sVar60) * sVar76;
                      sVar11 = auVar71._8_2_;
                      auVar89._8_2_ =
                           (ushort)(sVar80 < sVar11) * sVar11 | (ushort)(sVar80 >= sVar11) * sVar80;
                      sVar12 = auVar71._10_2_;
                      auVar89._10_2_ =
                           (ushort)(sVar82 < sVar12) * sVar12 | (ushort)(sVar82 >= sVar12) * sVar82;
                      sVar13 = auVar71._12_2_;
                      auVar89._12_2_ =
                           (ushort)(sVar84 < sVar13) * sVar13 | (ushort)(sVar84 >= sVar13) * sVar84;
                      sVar74 = auVar71._14_2_;
                      auVar89._14_2_ =
                           (ushort)(sVar78 < sVar74) * sVar74 | (ushort)(sVar78 >= sVar74) * sVar78;
                      *(undefined1 (*) [16])((long)*local_100 + lVar54) = auVar89;
                      auVar67 = paddsw(auVar107,*(undefined1 (*) [16])
                                                 ((long)pvVar5 + lVar54 + lVar48 * 0x10));
                      auVar108._0_2_ = -(ushort)(auVar67._0_2_ == auVar89._0_2_);
                      auVar108._2_2_ = -(ushort)(auVar67._2_2_ == auVar89._2_2_);
                      auVar108._4_2_ = -(ushort)(auVar67._4_2_ == auVar89._4_2_);
                      auVar108._6_2_ = -(ushort)(auVar67._6_2_ == auVar89._6_2_);
                      auVar108._8_2_ = -(ushort)(auVar67._8_2_ == auVar89._8_2_);
                      auVar108._10_2_ = -(ushort)(auVar67._10_2_ == auVar89._10_2_);
                      auVar108._12_2_ = -(ushort)(auVar67._12_2_ == auVar89._12_2_);
                      auVar108._14_2_ = -(ushort)(auVar67._14_2_ == auVar89._14_2_);
                      auVar72._0_2_ = -(ushort)(sVar8 < sVar61);
                      auVar72._2_2_ = -(ushort)(sVar9 < sVar75);
                      auVar72._4_2_ = -(ushort)(sVar10 < sVar77);
                      auVar72._6_2_ = -(ushort)(sVar60 < sVar76);
                      auVar72._8_2_ = -(ushort)(sVar11 < sVar80);
                      auVar72._10_2_ = -(ushort)(sVar12 < sVar82);
                      auVar72._12_2_ = -(ushort)(sVar13 < sVar84);
                      auVar72._14_2_ = -(ushort)(sVar74 < sVar78);
                      auVar109 = pblendvb(auVar66,*(undefined1 (*) [16])((long)*ptr_02 + lVar54),
                                          auVar72 | auVar108);
                      auVar67 = *(undefined1 (*) [16])
                                 ((long)((ppVar41->field_4).rowcols)->score_row + lVar54 + lVar51);
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar54) = auVar109;
                      *(undefined1 (*) [16])
                       ((long)((ppVar41->field_4).rowcols)->score_row + lVar54 + lVar51) =
                           auVar109 | auVar67 & auVar135;
                      piVar7 = ((ppVar41->field_4).rowcols)->score_row;
                      auVar105._0_2_ = -(ushort)(auVar103._0_2_ < auVar104._0_2_);
                      auVar105._2_2_ = -(ushort)(auVar103._2_2_ < auVar104._2_2_);
                      auVar105._4_2_ = -(ushort)(auVar103._4_2_ < auVar104._4_2_);
                      auVar105._6_2_ = -(ushort)(auVar103._6_2_ < auVar104._6_2_);
                      auVar105._8_2_ = -(ushort)(auVar103._8_2_ < auVar104._8_2_);
                      auVar105._10_2_ = -(ushort)(auVar103._10_2_ < auVar104._10_2_);
                      auVar105._12_2_ = -(ushort)(auVar103._12_2_ < auVar104._12_2_);
                      auVar105._14_2_ = -(ushort)(auVar103._14_2_ < auVar104._14_2_);
                      auVar67 = pblendvb(auVar133,auVar134,auVar105);
                      *(undefined1 (*) [16])((long)piVar7 + lVar54 + lVar51) =
                           *(undefined1 (*) [16])((long)piVar7 + lVar54 + lVar51) & auVar136 |
                           auVar67;
                      auVar26._4_4_ = uVar62;
                      auVar26._0_4_ = uVar62;
                      auVar26._8_4_ = uVar62;
                      auVar26._12_4_ = uVar62;
                      auVar104 = psubsw(auVar89,auVar26);
                      auVar29._4_4_ = uVar63;
                      auVar29._0_4_ = uVar63;
                      auVar29._8_4_ = uVar63;
                      auVar29._12_4_ = uVar63;
                      auVar67 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar54),auVar29);
                      sVar8 = auVar67._0_2_;
                      sVar61 = auVar104._0_2_;
                      sVar9 = auVar67._2_2_;
                      sVar75 = auVar104._2_2_;
                      sVar10 = auVar67._4_2_;
                      sVar77 = auVar104._4_2_;
                      sVar60 = auVar67._6_2_;
                      sVar76 = auVar104._6_2_;
                      sVar11 = auVar67._8_2_;
                      sVar80 = auVar104._8_2_;
                      sVar12 = auVar67._10_2_;
                      sVar82 = auVar104._10_2_;
                      sVar13 = auVar67._12_2_;
                      sVar84 = auVar104._12_2_;
                      sVar78 = auVar104._14_2_;
                      sVar74 = auVar67._14_2_;
                      puVar2 = (ushort *)((long)*local_d0 + lVar54);
                      *puVar2 = (ushort)(sVar61 < sVar8) * sVar8 |
                                (ushort)(sVar61 >= sVar8) * sVar61;
                      puVar2[1] = (ushort)(sVar75 < sVar9) * sVar9 |
                                  (ushort)(sVar75 >= sVar9) * sVar75;
                      puVar2[2] = (ushort)(sVar77 < sVar10) * sVar10 |
                                  (ushort)(sVar77 >= sVar10) * sVar77;
                      puVar2[3] = (ushort)(sVar76 < sVar60) * sVar60 |
                                  (ushort)(sVar76 >= sVar60) * sVar76;
                      puVar2[4] = (ushort)(sVar80 < sVar11) * sVar11 |
                                  (ushort)(sVar80 >= sVar11) * sVar80;
                      puVar2[5] = (ushort)(sVar82 < sVar12) * sVar12 |
                                  (ushort)(sVar82 >= sVar12) * sVar82;
                      puVar2[6] = (ushort)(sVar84 < sVar13) * sVar13 |
                                  (ushort)(sVar84 >= sVar13) * sVar84;
                      puVar2[7] = (ushort)(sVar78 < sVar74) * sVar74 |
                                  (ushort)(sVar78 >= sVar74) * sVar78;
                      if (uVar1 < uVar56) {
                        auVar73._0_2_ = -(ushort)(sVar8 < sVar61);
                        auVar73._2_2_ = -(ushort)(sVar9 < sVar75);
                        auVar73._4_2_ = -(ushort)(sVar10 < sVar77);
                        auVar73._6_2_ = -(ushort)(sVar60 < sVar76);
                        auVar73._8_2_ = -(ushort)(sVar11 < sVar80);
                        auVar73._10_2_ = -(ushort)(sVar12 < sVar82);
                        auVar73._12_2_ = -(ushort)(sVar13 < sVar84);
                        auVar73._14_2_ = -(ushort)(sVar74 < sVar78);
                        auVar67 = pmovsxbw(auVar67,0x1010101010101010);
                        auVar67 = pblendvb(auVar67,_DAT_008d0b90,auVar73);
                        *(undefined1 (*) [16])
                         ((long)((ppVar41->field_4).rowcols)->score_row + lVar54 + local_110) =
                             auVar67;
                      }
                      uVar119 = ((short)auVar89._0_2_ < (short)uVar119) * auVar89._0_2_ |
                                ((short)auVar89._0_2_ >= (short)uVar119) * uVar119;
                      uVar86 = ((short)auVar89._2_2_ < (short)uVar86) * auVar89._2_2_ |
                               ((short)auVar89._2_2_ >= (short)uVar86) * uVar86;
                      uVar64 = CONCAT22(uVar86,uVar119);
                      uVar123 = ((short)auVar89._4_2_ < (short)uVar123) * auVar89._4_2_ |
                                ((short)auVar89._4_2_ >= (short)uVar123) * uVar123;
                      uVar91 = ((short)auVar89._6_2_ < (short)uVar91) * auVar89._6_2_ |
                               ((short)auVar89._6_2_ >= (short)uVar91) * uVar91;
                      uVar32 = CONCAT22(uVar91,uVar123);
                      uVar92 = ((short)auVar89._8_2_ < (short)uVar92) * auVar89._8_2_ |
                               ((short)auVar89._8_2_ >= (short)uVar92) * uVar92;
                      uVar128 = ((short)auVar89._10_2_ < (short)uVar128) * auVar89._10_2_ |
                                ((short)auVar89._10_2_ >= (short)uVar128) * uVar128;
                      uVar33 = CONCAT22(uVar128,uVar92);
                      uVar130 = ((short)auVar89._12_2_ < (short)uVar130) * auVar89._12_2_ |
                                ((short)auVar89._12_2_ >= (short)uVar130) * uVar130;
                      uVar93 = ((short)auVar89._14_2_ < (short)uVar93) * auVar89._14_2_ |
                               ((short)auVar89._14_2_ >= (short)uVar93) * uVar93;
                      uVar34 = CONCAT22(uVar93,uVar130);
                      uVar110 = ((short)uVar110 < (short)auVar89._0_2_) * auVar89._0_2_ |
                                ((short)uVar110 >= (short)auVar89._0_2_) * uVar110;
                      uVar111 = ((short)uVar111 < (short)auVar89._2_2_) * auVar89._2_2_ |
                                ((short)uVar111 >= (short)auVar89._2_2_) * uVar111;
                      uVar112 = ((short)uVar112 < (short)auVar89._4_2_) * auVar89._4_2_ |
                                ((short)uVar112 >= (short)auVar89._4_2_) * uVar112;
                      uVar113 = ((short)uVar113 < (short)auVar89._6_2_) * auVar89._6_2_ |
                                ((short)uVar113 >= (short)auVar89._6_2_) * uVar113;
                      uVar114 = ((short)uVar114 < (short)auVar89._8_2_) * auVar89._8_2_ |
                                ((short)uVar114 >= (short)auVar89._8_2_) * uVar114;
                      uVar115 = ((short)uVar115 < (short)auVar89._10_2_) * auVar89._10_2_ |
                                ((short)uVar115 >= (short)auVar89._10_2_) * uVar115;
                      uVar116 = ((short)uVar116 < (short)auVar89._12_2_) * auVar89._12_2_ |
                                ((short)uVar116 >= (short)auVar89._12_2_) * uVar116;
                      uVar117 = ((short)uVar117 < (short)auVar89._14_2_) * auVar89._14_2_ |
                                ((short)uVar117 >= (short)auVar89._14_2_) * uVar117;
                      auVar30._4_4_ = uVar63;
                      auVar30._0_4_ = uVar63;
                      auVar30._8_4_ = uVar63;
                      auVar30._12_4_ = uVar63;
                      auVar67 = psubsw(auVar71,auVar30);
                      auVar90._0_2_ = -(ushort)(auVar67._0_2_ < sVar61);
                      auVar90._2_2_ = -(ushort)(auVar67._2_2_ < sVar75);
                      auVar90._4_2_ = -(ushort)(auVar67._4_2_ < sVar77);
                      auVar90._6_2_ = -(ushort)(auVar67._6_2_ < sVar76);
                      auVar90._8_2_ = -(ushort)(auVar67._8_2_ < sVar80);
                      auVar90._10_2_ = -(ushort)(auVar67._10_2_ < sVar82);
                      auVar90._12_2_ = -(ushort)(auVar67._12_2_ < sVar84);
                      auVar90._14_2_ = -(ushort)(auVar67._14_2_ < sVar78);
                      auVar109 = auVar71;
                      if ((ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar90._14_2_ >> 7) & 1) << 0xe |
                                  auVar90._14_2_ & 0x8000) == 0xffff) break;
                      auVar31._4_4_ = uVar63;
                      auVar31._0_4_ = uVar63;
                      auVar31._8_4_ = uVar63;
                      auVar31._12_4_ = uVar63;
                      auVar103 = psubsw(auVar132,auVar31);
                      sVar8 = auVar103._0_2_;
                      auVar132._0_2_ =
                           (ushort)(sVar61 < sVar8) * sVar8 | (ushort)(sVar61 >= sVar8) * sVar61;
                      sVar8 = auVar103._2_2_;
                      auVar132._2_2_ =
                           (ushort)(sVar75 < sVar8) * sVar8 | (ushort)(sVar75 >= sVar8) * sVar75;
                      sVar8 = auVar103._4_2_;
                      auVar132._4_2_ =
                           (ushort)(sVar77 < sVar8) * sVar8 | (ushort)(sVar77 >= sVar8) * sVar77;
                      sVar8 = auVar103._6_2_;
                      auVar132._6_2_ =
                           (ushort)(sVar76 < sVar8) * sVar8 | (ushort)(sVar76 >= sVar8) * sVar76;
                      sVar8 = auVar103._8_2_;
                      auVar132._8_2_ =
                           (ushort)(sVar80 < sVar8) * sVar8 | (ushort)(sVar80 >= sVar8) * sVar80;
                      sVar8 = auVar103._10_2_;
                      auVar132._10_2_ =
                           (ushort)(sVar82 < sVar8) * sVar8 | (ushort)(sVar82 >= sVar8) * sVar82;
                      sVar8 = auVar103._12_2_;
                      auVar132._12_2_ =
                           (ushort)(sVar84 < sVar8) * sVar8 | (ushort)(sVar84 >= sVar8) * sVar84;
                      sVar8 = auVar103._14_2_;
                      auVar132._14_2_ =
                           (ushort)(sVar78 < sVar8) * sVar8 | (ushort)(sVar78 >= sVar8) * sVar78;
                      auVar107 = *(undefined1 (*) [16])((long)*ptr + lVar54);
                      bVar59 = uVar44 < uVar58;
                      lVar54 = lVar54 + 0x10;
                      uVar44 = uVar44 + 1;
                      auVar109 = auVar67;
                      auVar71 = auVar67;
                    } while (lVar55 != lVar54);
                  } while ((!bVar59) && (bVar59 = uVar35 < 7, uVar35 = uVar35 + 1, bVar59));
                  local_110 = local_110 + lVar57;
                  lVar51 = lVar51 + lVar57;
                  palVar43 = local_d0;
                  uVar53 = uVar1;
                  palVar42 = local_100;
                  if (uVar1 == uVar52) {
                    uVar56 = local_100[(uint)(iVar37 % a)][0];
                    uVar58 = local_100[(uint)(iVar37 % a)][1];
                    if (iVar37 / a < 7) {
                      iVar40 = 1;
                      if (1 < iVar39) {
                        iVar40 = iVar39;
                      }
                      do {
                        uVar58 = uVar58 << 0x10 | uVar56 >> 0x30;
                        iVar40 = iVar40 + -1;
                        uVar56 = uVar56 << 0x10;
                      } while (iVar40 != 0);
                    }
                    auVar65._0_2_ = -(ushort)((short)uVar119 < (short)local_88);
                    auVar65._2_2_ = -(ushort)((short)uVar86 < (short)uStack_86);
                    auVar65._4_2_ = -(ushort)((short)uVar123 < (short)local_88);
                    auVar65._6_2_ = -(ushort)((short)uVar91 < (short)uStack_86);
                    auVar65._8_2_ = -(ushort)((short)uVar92 < (short)local_88);
                    auVar65._10_2_ = -(ushort)((short)uVar128 < (short)uStack_86);
                    auVar65._12_2_ = -(ushort)((short)uVar130 < (short)local_88);
                    auVar65._14_2_ = -(ushort)((short)uVar93 < (short)uStack_86);
                    auVar66._0_2_ = -(ushort)(sVar121 < (short)uVar110);
                    auVar66._2_2_ = -(ushort)(sVar124 < (short)uVar111);
                    auVar66._4_2_ = -(ushort)(sVar121 < (short)uVar112);
                    auVar66._6_2_ = -(ushort)(sVar124 < (short)uVar113);
                    auVar66._8_2_ = -(ushort)(sVar121 < (short)uVar114);
                    auVar66._10_2_ = -(ushort)(sVar124 < (short)uVar115);
                    auVar66._12_2_ = -(ushort)(sVar121 < (short)uVar116);
                    auVar66._14_2_ = -(ushort)(sVar124 < (short)uVar117);
                    auVar66 = auVar66 | auVar65;
                    if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar66 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar66 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar66 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar66 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar66 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar66 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar66 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar66 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar66 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar66 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar66 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar66 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar66[0xf]) {
                      sVar121 = (short)(uVar58 >> 0x30);
                    }
                    else {
                      *(byte *)&ppVar41->flag = (byte)ppVar41->flag | 0x40;
                      sVar121 = 0;
                      iVar38 = 0;
                      iVar37 = 0;
                    }
                    ppVar41->score = (int)sVar121;
                    ppVar41->end_query = iVar37;
                    ppVar41->end_ref = iVar38;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_d0);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(local_100);
                    return ppVar41;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8(
                        _mm_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}